

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

void __thiscall
node::anon_unknown_2::ChainImpl::waitForNotificationsIfTipChanged(ChainImpl *this,uint256 *old_tip)

{
  bool bVar1;
  ChainstateManager *this_00;
  Chainstate *pCVar2;
  ValidationSignals *this_01;
  long in_FS_OFFSET;
  unique_lock<std::recursive_mutex> local_50;
  base_blob<256U> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = base_blob<256U>::IsNull(&old_tip->super_base_blob<256U>);
  if (!bVar1) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_50,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
               ,0x313,false);
    this_00 = chainman(this);
    pCVar2 = ChainstateManager::ActiveChainstate(this_00);
    CBlockIndex::GetBlockHash
              ((uint256 *)&local_40,
               (pCVar2->m_chain).vChain.
               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1]);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_50);
    bVar1 = ::operator==(&old_tip->super_base_blob<256U>,&local_40);
    if (bVar1) goto LAB_007a5749;
  }
  this_01 = validation_signals(this);
  ValidationSignals::SyncWithValidationInterfaceQueue(this_01);
LAB_007a5749:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void waitForNotificationsIfTipChanged(const uint256& old_tip) override
    {
        if (!old_tip.IsNull() && old_tip == WITH_LOCK(::cs_main, return chainman().ActiveChain().Tip()->GetBlockHash())) return;
        validation_signals().SyncWithValidationInterfaceQueue();
    }